

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestAds::testAdsReadWriteReqEx2(TestAds *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  test_info *ptVar2;
  pointer pcVar3;
  long lVar4;
  ostream *poVar5;
  byte bVar6;
  int iVar7;
  bool bVar8;
  uint32_t bytesRead;
  uint32_t buffer;
  string local_78;
  long local_58;
  uint32_t outBuffer;
  uint local_4c;
  char handleName [12];
  AmsAddr unknown;
  
  builtin_strncpy(handleName,"MAIN.byByte",0xc);
  local_58 = AdsPortOpenEx();
  bVar8 = local_58 != 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  paVar1 = &local_78.field_2;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1db);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,&local_4c,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_78,
             "0 == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(hHandle), &hHandle, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1e2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 4;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"sizeof(hHandle) == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1e3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  outBuffer = 0xdeadbeef;
  iVar7 = 0;
  do {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncWriteReqEx(local_58,&server,0xf005,local_4c,4,&outBuffer);
    if ((lVar4 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_78,
                 "0 == AdsSyncWriteReqEx(port, &server, 0xF005, hHandle, sizeof(outBuffer), &outBuffer)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x1ee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncReadReqEx2(local_58,&server,0xf005,local_4c,4,&buffer,&bytesRead);
    bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    if ((lVar4 != 0) != (bool)bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_78,
                 "0 == AdsSyncReadReqEx2(port, &server, 0xF005, hHandle, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x1f2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((bytesRead != 4) != (bool)(bVar6 & 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_78,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,499);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((outBuffer != buffer) != (bool)(bVar6 & 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_78,"outBuffer == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    outBuffer = ~outBuffer;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 10);
  lVar4 = AdsSyncWriteReqEx(local_58,&server,0xf006,0,4,&local_4c);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_78,
             "0 == AdsSyncWriteReqEx(port, &server, 0xF006, 0, sizeof(hHandle), &hHandle)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2(0,&server,0xf003,0,4,&buffer,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x748,&local_78,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadWriteReqEx2(0, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1ff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0xdeadbeef;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2
                    (local_58,(AmsAddr *)0x0,0xf003,0,4,&buffer,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x749,&local_78,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadWriteReqEx2(port, nullptr, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x207);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0xdeadbeef;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&unknown,0xf003,0,4,&buffer,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 7,&local_78,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadWriteReqEx2(port, &unknown, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x211);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  buffer = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,&buffer,0xc,handleName,(uint *)0x0);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_78,
             "0 == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = buffer != 0xdeadbeef;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0xDEADBEEF != buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x219);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,(void *)0x0,0xc,handleName,(uint *)0x0)
  ;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_78,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName), handleName, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x21f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,(void *)0x0,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_78,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x223);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,0,&buffer,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x705,&local_78,
             "ADSERR_DEVICE_INVALIDSIZE == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, 0, &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x229);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x22a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,&buffer,0xc,(void *)0x0,(uint *)0x0);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_78,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), nullptr, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,&buffer,0xc,(void *)0x0,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_78,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), nullptr, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x234);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,&buffer,0,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x710,&local_78,
             "ADSERR_DEVICE_SYMBOLNOTFOUND == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 0, handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x23a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x23b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0xf003,0,4,&buffer,3,"xxx",&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x710,&local_78,
             "ADSERR_DEVICE_SYMBOLNOTFOUND == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 3, \"xxx\", &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x241);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x242);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2(local_58,&server,0,0,4,&buffer,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x701,&local_78,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadWriteReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x249);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x24a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bytesRead = 0xdeadbeef;
  lVar4 = AdsSyncReadWriteReqEx2
                    (local_58,&server,0x4025,0x10000,4,&buffer,0xc,handleName,&bytesRead);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x701,&local_78,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadWriteReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x251);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar8 = bytesRead == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_78,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x252);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = AdsPortCloseEx(local_58);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_78,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x253);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void testAdsReadWriteReqEx2(const std::string&)
    {
        char handleName[] = "MAIN.byByte";
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint32_t hHandle;
        uint32_t bytesRead;
        fructose_assert(0 ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(hHandle), &hHandle, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(sizeof(hHandle) == bytesRead);
        hHandle = bhf::ads::letoh(hHandle);

        uint32_t buffer;
        uint32_t outBuffer = 0xDEADBEEF;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncWriteReqEx(port,
                                                           &server,
                                                           0xF005,
                                                           hHandle,
                                                           sizeof(outBuffer),
                                                           &outBuffer));
            fructose_loop_assert(i,
                                 0 ==
                                 AdsSyncReadReqEx2(port, &server, 0xF005, hHandle, sizeof(buffer), &buffer,
                                                   &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, outBuffer == buffer);
            outBuffer = ~outBuffer;
        }
        hHandle = bhf::ads::htole(hHandle);
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0xF006, 0, sizeof(hHandle), &hHandle));

        // provide out of range port
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncReadWriteReqEx2(0, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide nullptr to AmsAddr
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncReadWriteReqEx2(port, nullptr, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide unknown AmsAddr
        bytesRead = 0xDEADBEEF;
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncReadWriteReqEx2(port, &unknown, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to bytesRead
        buffer = 0xDEADBEEF;
        fructose_assert(0 ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               nullptr));
        fructose_assert(0xDEADBEEF != buffer);

        // provide nullptr to readBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName),
                                               handleName,
                                               nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName),
                                               handleName,
                                               &bytesRead));

        // provide 0 length readBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_INVALIDSIZE ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, 0, &buffer, sizeof(handleName), handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to writeBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               nullptr,
                                               nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               nullptr,
                                               &bytesRead));

        // provide 0 length writeBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SYMBOLNOTFOUND ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 0, handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid writeBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SYMBOLNOTFOUND ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 3, "xxx",
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexGroup
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadWriteReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexOffset
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadWriteReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer,
                                               sizeof(handleName), handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);
        fructose_assert(0 == AdsPortCloseEx(port));
    }